

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::basic_json_parser
          (basic_json_parser<char,_std::allocator<char>_> *this,
          basic_json_decode_options<char> *options,allocator<char> *temp_alloc)

{
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> local_40;
  
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::function
            (&local_40,&options->err_handler_);
  basic_json_parser(this,options,&local_40,temp_alloc);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  return;
}

Assistant:

basic_json_parser(const basic_json_decode_options<char_type>& options, 
                      const TempAllocator& temp_alloc = TempAllocator())
        : basic_json_parser(options, options.err_handler(), temp_alloc)
    {
    }